

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

Model * gvr::loadPLY(char *name)

{
  _Rb_tree_node_base *p_Var1;
  ply_type pVar2;
  ply_type pVar3;
  ply_type pVar4;
  int iVar5;
  long lVar6;
  TexturedMesh *this;
  ulong uVar7;
  ImageIO *this_00;
  _Rb_tree_node_base *p_Var8;
  int __oflag;
  pointer pcVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  TexturedMesh *pTVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  string s;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  PLYReader ply;
  string local_490;
  string local_470;
  string local_450;
  undefined1 local_430 [32];
  _Rb_tree_node_base *local_410;
  size_t local_408;
  string local_400;
  string local_3e0;
  char *local_3c0;
  long local_3b8;
  undefined1 *local_3b0 [2];
  undefined1 local_3a0 [16];
  undefined1 *local_390 [2];
  undefined1 local_380 [16];
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  undefined1 *local_2b0 [2];
  undefined1 local_2a0 [16];
  undefined1 *local_290 [2];
  undefined1 local_280 [16];
  PLYReader local_270;
  
  local_270.filename._M_dataplus._M_p = (pointer)&local_270.filename.field_2;
  local_270.filename._M_string_length = 0;
  local_270.filename.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&local_270.in);
  local_270.list.super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_270.list.super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_270.list.super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PLYReader::open(&local_270,name,__oflag);
  pcVar9 = local_430 + 0x10;
  local_430._0_8_ = pcVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"vertex","");
  lVar6 = PLYReader::instancesOfElement(&local_270,(string *)local_430);
  if ((pointer)local_430._0_8_ != pcVar9) {
    operator_delete((void *)local_430._0_8_);
  }
  local_430._0_8_ = pcVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"face","");
  local_3b8 = PLYReader::instancesOfElement(&local_270,(string *)local_430);
  if ((pointer)local_430._0_8_ != pcVar9) {
    operator_delete((void *)local_430._0_8_);
  }
  local_430._0_8_ = pcVar9;
  local_3c0 = name;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"vertex","");
  paVar10 = &local_490.field_2;
  local_490._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"diffuse_red","");
  pVar2 = PLYReader::getTypeOfProperty(&local_270,(string *)local_430,&local_490);
  bVar12 = true;
  if (pVar2 == ply_none) {
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"vertex","");
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"red","");
    pVar2 = PLYReader::getTypeOfProperty(&local_270,&local_3e0,&local_400);
    bVar12 = true;
    if (pVar2 == ply_none) {
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"vertex","");
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"r","");
      pVar2 = PLYReader::getTypeOfProperty(&local_270,&local_450,&local_470);
      bVar12 = pVar2 != ply_none;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != paVar10) {
    operator_delete(local_490._M_dataplus._M_p);
  }
  if ((pointer)local_430._0_8_ != pcVar9) {
    operator_delete((void *)local_430._0_8_);
  }
  local_430._0_8_ = pcVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"vertex","");
  local_490._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"u","");
  pVar2 = PLYReader::getTypeOfProperty(&local_270,(string *)local_430,&local_490);
  if (pVar2 == ply_none) {
LAB_001224e7:
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"vertex","");
    local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"texture_u","");
    pVar3 = PLYReader::getTypeOfProperty(&local_270,&local_450,&local_470);
    if (pVar3 == ply_none) {
LAB_001225bc:
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"vertex","");
      local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"s","");
      pVar4 = PLYReader::getTypeOfProperty(&local_270,&local_310,&local_330);
      if (pVar4 == ply_none) {
        bVar13 = false;
      }
      else {
        local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"vertex","");
        local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"t","");
        pVar4 = PLYReader::getTypeOfProperty(&local_270,&local_350,&local_370);
        bVar13 = pVar4 != ply_none;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          operator_delete(local_370._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
          operator_delete(local_350._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p);
      }
      if (pVar3 != ply_none) goto LAB_0012270a;
    }
    else {
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"vertex","");
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"texture_v","");
      pVar4 = PLYReader::getTypeOfProperty(&local_270,&local_2d0,&local_2f0);
      bVar13 = true;
      if (pVar4 == ply_none) goto LAB_001225bc;
LAB_0012270a:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      operator_delete(local_470._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p);
    }
    if (pVar2 != ply_none) goto LAB_0012275d;
  }
  else {
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"vertex","");
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"v","");
    pVar3 = PLYReader::getTypeOfProperty(&local_270,&local_3e0,&local_400);
    bVar13 = true;
    if (pVar3 == ply_none) goto LAB_001224e7;
LAB_0012275d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p);
    }
  }
  paVar10 = &local_490.field_2;
  pcVar9 = local_430 + 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != paVar10) {
    operator_delete(local_490._M_dataplus._M_p);
  }
  if ((pointer)local_430._0_8_ != pcVar9) {
    operator_delete((void *)local_430._0_8_);
  }
  local_430._0_8_ = pcVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"face","");
  local_490._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"texcoord","");
  pVar2 = PLYReader::getTypeOfProperty(&local_270,(string *)local_430,&local_490);
  if (pVar2 == ply_none) {
    bVar14 = false;
  }
  else {
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"face","");
    local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"texnumber","");
    pVar2 = PLYReader::getTypeOfProperty(&local_270,&local_450,&local_470);
    bVar14 = pVar2 != ply_none;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      operator_delete(local_470._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != paVar10) {
    operator_delete(local_490._M_dataplus._M_p);
  }
  if ((pointer)local_430._0_8_ != pcVar9) {
    operator_delete((void *)local_430._0_8_);
  }
  if ((int)lVar6 < 1) {
    this = (TexturedMesh *)0x0;
    goto LAB_00122bac;
  }
  if ((int)local_3b8 < 1) {
    if (bVar12) {
      this = (TexturedMesh *)operator_new(0xb0);
      ColoredPointCloud::ColoredPointCloud((ColoredPointCloud *)this);
    }
    else {
      this = (TexturedMesh *)operator_new(0xa8);
      PointCloud::PointCloud((PointCloud *)this);
    }
LAB_00122962:
    pTVar11 = (TexturedMesh *)0x0;
  }
  else {
    if (bVar14) {
      this = (TexturedMesh *)operator_new(0x100);
      MultiTexturedMesh::MultiTexturedMesh((MultiTexturedMesh *)this);
      goto LAB_00122962;
    }
    if (!bVar13) {
      if (bVar12) {
        this = (TexturedMesh *)operator_new(200);
        ColoredMesh::ColoredMesh((ColoredMesh *)this);
      }
      else {
        this = (TexturedMesh *)operator_new(0xc0);
        Mesh::Mesh((Mesh *)this);
      }
      goto LAB_00122962;
    }
    this = (TexturedMesh *)operator_new(0x108);
    TexturedMesh::TexturedMesh(this);
    pTVar11 = this;
  }
  (*(this->super_Mesh).super_PointCloud.super_Model._vptr_Model[6])(this,&local_270);
  if ((pTVar11 != (TexturedMesh *)0x0) && ((pTVar11->name)._M_string_length == 0)) {
    std::__cxx11::string::string((string *)&local_490,local_3c0,(allocator *)local_430);
    uVar7 = std::__cxx11::string::rfind((char)&local_490,0x2e);
    if (uVar7 < local_490._M_string_length) {
      p_Var1 = (_Rb_tree_node_base *)(local_430 + 8);
      local_430._8_4_ = _S_red;
      local_430._16_8_ = 0;
      local_408 = 0;
      local_430._24_8_ = p_Var1;
      local_410 = p_Var1;
      std::__cxx11::string::substr((ulong)&local_450,(ulong)&local_490);
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"");
      gutil::getFileList((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_430,&local_450,&local_470);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p);
      }
      if ((_Rb_tree_node_base *)local_430._24_8_ != p_Var1) {
        p_Var8 = (_Rb_tree_node_base *)local_430._24_8_;
        do {
          iVar5 = std::__cxx11::string::compare((string *)&local_490);
          if (iVar5 != 0) {
            this_00 = gimage::getImageIO();
            bVar12 = gimage::ImageIO::handlesFile(this_00,*(char **)(p_Var8 + 1),true);
            if (bVar12) {
              std::__cxx11::string::_M_assign((string *)&local_490);
              lVar6 = std::__cxx11::string::rfind((char)&local_490,0x2f);
              if ((lVar6 == -1) &&
                 (lVar6 = std::__cxx11::string::rfind((char)&local_490,0x5c), lVar6 == -1)) {
                local_390[0] = local_380;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"");
                std::__cxx11::string::_M_assign((string *)&pTVar11->basepath);
                if (local_390[0] != local_380) {
                  operator_delete(local_390[0]);
                }
                local_3b0[0] = local_3a0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_3b0,local_490._M_dataplus._M_p,
                           local_490._M_dataplus._M_p + local_490._M_string_length);
                std::__cxx11::string::_M_assign((string *)&pTVar11->name);
                local_2b0[0] = local_3b0[0];
                if (local_3b0[0] == local_3a0) break;
              }
              else {
                std::__cxx11::string::substr((ulong)local_290,(ulong)&local_490);
                std::__cxx11::string::_M_assign((string *)&pTVar11->basepath);
                if (local_290[0] != local_280) {
                  operator_delete(local_290[0]);
                }
                std::__cxx11::string::substr((ulong)local_2b0,(ulong)&local_490);
                std::__cxx11::string::_M_assign((string *)&pTVar11->name);
                if (local_2b0[0] == local_2a0) break;
              }
              operator_delete(local_2b0[0]);
              break;
            }
          }
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        } while (p_Var8 != p_Var1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_430);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p != &local_490.field_2) {
      operator_delete(local_490._M_dataplus._M_p);
    }
  }
LAB_00122bac:
  PLYReader::~PLYReader(&local_270);
  return (Model *)this;
}

Assistant:

Model *loadPLY(const char *name)
{
  PLYReader ply;

  ply.open(name);

  // determine data type

  int vn=static_cast<int>(ply.instancesOfElement("vertex"));
  int tn=static_cast<int>(ply.instancesOfElement("face"));

  bool pervertexcolor=ply.getTypeOfProperty("vertex", "diffuse_red") != ply_none ||
                      ply.getTypeOfProperty("vertex", "red") != ply_none ||
                      ply.getTypeOfProperty("vertex", "r") != ply_none;

  bool texture=(ply.getTypeOfProperty("vertex", "u") != ply_none &&
                ply.getTypeOfProperty("vertex", "v") != ply_none) ||
               (ply.getTypeOfProperty("vertex", "texture_u") != ply_none &&
                ply.getTypeOfProperty("vertex", "texture_v") != ply_none) ||
               (ply.getTypeOfProperty("vertex", "s") != ply_none &&
                ply.getTypeOfProperty("vertex", "t") != ply_none);

  bool multitexture=ply.getTypeOfProperty("face", "texcoord") != ply_none &&
                    ply.getTypeOfProperty("face", "texnumber") != ply_none;

  // create best data type

  Model *model=0;
  TexturedMesh *tm=0;

  if (vn > 0)
  {
    if (tn > 0)
    {
      if (multitexture)
      {
        model=new MultiTexturedMesh();
      }
      else if (texture)
      {
        model=tm=new TexturedMesh();
      }
      else if (pervertexcolor)
      {
        model=new ColoredMesh();
      }
      else
      {
        model=new Mesh();
      }
    }
    else
    {
      if (pervertexcolor)
      {
        model=new ColoredPointCloud();
      }
      else
      {
        model=new PointCloud();
      }
    }

    // load from PLY into the allocated data set

    model->loadPLY(ply);
  }

  // optionally try to guess the name of the texture from the file name

  if (tm != 0 && tm->getTextureName().size() == 0)
  {
    std::string s=name;
    size_t i=s.rfind('.');

    if (i < s.size())
    {
      std::set<std::string> list;
      gutil::getFileList(list, s.substr(0, i+1), "");

      for (std::set<std::string>::iterator it=list.begin(); it!=list.end(); ++it)
      {
        if (s.compare(*it) != 0  && gimage::getImageIO().handlesFile(it->c_str(), true))
        {
          s=*it;

          i=s.rfind('/');

          if (i == s.npos)
          {
            i=s.rfind('\\');
          }

          if (i != s.npos)
          {
            tm->setBasePath(s.substr(0, i+1));
            tm->setTextureName(s.substr(i+1));
          }
          else
          {
            tm->setBasePath("");
            tm->setTextureName(s);
          }

          break;
        }
      }
    }
  }

  return model;
}